

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O1

void bidiag(double *A,int M,int N)

{
  size_t __size;
  ulong uVar1;
  int iVar2;
  int iVar3;
  double *x;
  double *v;
  double *A_00;
  double *C;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int N_00;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int m;
  long lVar16;
  double dVar17;
  double *local_c8;
  double *local_50;
  
  if (N <= M) {
    uVar7 = (ulong)(uint)N;
    lVar16 = (long)M;
    __size = lVar16 * 8;
    x = (double *)malloc(__size);
    v = (double *)malloc(__size);
    A_00 = (double *)malloc((long)N * __size);
    C = (double *)malloc(__size * lVar16);
    if (0 < N) {
      uVar1 = (ulong)(uint)M;
      lVar14 = uVar7 << 0x20;
      local_c8 = A + uVar7;
      uVar8 = uVar7;
      uVar10 = uVar1;
      uVar12 = 0;
      lVar15 = lVar14;
      local_50 = A;
      do {
        lVar15 = lVar15 + -0x100000000;
        if ((long)uVar12 < lVar16) {
          uVar5 = 0;
          pdVar4 = local_50;
          do {
            x[uVar5] = *pdVar4;
            uVar5 = uVar5 + 1;
            pdVar4 = pdVar4 + uVar7;
          } while (uVar10 != uVar5);
        }
        iVar2 = (int)uVar12;
        N_00 = M - iVar2;
        dVar17 = house(x,N_00,v);
        if ((long)uVar12 < lVar16) {
          lVar6 = 0;
          pdVar4 = local_50;
          uVar5 = uVar12;
          do {
            uVar11 = 0;
            lVar13 = lVar6;
            do {
              *(double *)((long)A_00 + (lVar13 >> 0x1d)) = pdVar4[uVar11];
              lVar13 = lVar13 + (uVar10 << 0x20);
              uVar11 = uVar11 + 1;
            } while (uVar8 != uVar11);
            uVar5 = uVar5 + 1;
            lVar6 = lVar6 + 0x100000000;
            pdVar4 = pdVar4 + uVar7;
          } while (uVar5 != uVar1);
        }
        m = N - iVar2;
        mmult(A_00,v,C,m,N_00,1);
        scale(C,N - iVar2,1,dVar17);
        mmult(v,C,A_00,N_00,1,m);
        if ((long)uVar12 < lVar16) {
          lVar6 = 0;
          pdVar4 = local_50;
          uVar5 = uVar12;
          do {
            uVar11 = 0;
            lVar13 = lVar6;
            do {
              pdVar4[uVar11] = pdVar4[uVar11] - *(double *)((long)A_00 + (lVar13 >> 0x1d));
              uVar11 = uVar11 + 1;
              lVar13 = lVar13 + 0x100000000;
            } while (uVar8 != uVar11);
            uVar5 = uVar5 + 1;
            pdVar4 = pdVar4 + uVar7;
            lVar6 = lVar6 + lVar14;
          } while (uVar5 != uVar1);
        }
        uVar5 = uVar12 + 1;
        if ((long)uVar5 < lVar16) {
          uVar11 = 1;
          pdVar4 = local_c8;
          do {
            *pdVar4 = v[uVar11];
            pdVar4 = pdVar4 + uVar7;
            uVar11 = uVar11 + 1;
          } while (uVar10 != uVar11);
        }
        if ((long)uVar12 < (long)(N + -2)) {
          iVar3 = (N + 1) * iVar2;
          if (uVar5 < uVar7) {
            memcpy(x,A + (iVar3 + 1),(ulong)(uint)((N + -2) - iVar2) * 8 + 8);
          }
          dVar17 = house(x,(N - iVar2) + -1,v);
          if ((long)uVar12 < lVar16) {
            lVar6 = 0;
            pdVar4 = local_50;
            uVar11 = uVar12;
            do {
              if (uVar5 < uVar7) {
                uVar9 = 1;
                lVar13 = lVar6;
                do {
                  *(double *)((long)A_00 + (lVar13 >> 0x1d)) = pdVar4[uVar9];
                  uVar9 = uVar9 + 1;
                  lVar13 = lVar13 + 0x100000000;
                } while (uVar8 != uVar9);
              }
              uVar11 = uVar11 + 1;
              pdVar4 = pdVar4 + uVar7;
              lVar6 = lVar6 + lVar15;
            } while (uVar11 != uVar1);
          }
          mmult(A_00,v,C,N_00,m + -1,1);
          scale(C,N_00,1,dVar17);
          mmult(C,v,A_00,N_00,1,m + -1);
          if ((long)uVar12 < lVar16) {
            lVar6 = 0;
            pdVar4 = local_50;
            uVar11 = uVar12;
            do {
              if (uVar5 < uVar7) {
                uVar9 = 1;
                lVar13 = lVar6;
                do {
                  pdVar4[uVar9] = pdVar4[uVar9] - *(double *)((long)A_00 + (lVar13 >> 0x1d));
                  uVar9 = uVar9 + 1;
                  lVar13 = lVar13 + 0x100000000;
                } while (uVar8 != uVar9);
              }
              uVar11 = uVar11 + 1;
              pdVar4 = pdVar4 + uVar7;
              lVar6 = lVar6 + lVar15;
            } while (uVar11 != uVar1);
          }
          if (uVar12 + 2 < uVar7) {
            memcpy(A + (iVar3 + 2),v + 1,(ulong)(uint)((N + -3) - iVar2) * 8 + 8);
          }
        }
        uVar10 = uVar10 - 1;
        local_50 = local_50 + uVar7 + 1;
        uVar8 = uVar8 - 1;
        lVar14 = lVar14 + -0x100000000;
        local_c8 = local_c8 + uVar7 + 1;
        uVar12 = uVar5;
      } while (uVar5 != uVar7);
    }
    free(x);
    free(v);
    free(A_00);
    return;
  }
  printf("M should be greater than or equal to N");
  exit(1);
}

Assistant:

void bidiag(double *A, int M, int N) {
	int j,i,k,u,t;
	double *x,*v,*AT,*w;
	double beta;

	if (M < N) {
			printf("M should be greater than or equal to N");
			exit(1);
	}
	x = (double*) malloc(sizeof(double) * M);
	v = (double*) malloc(sizeof(double) * M);
	AT = (double*) malloc(sizeof(double) * M * N);
	w = (double*) malloc(sizeof(double) * M * M);


	for(j = 0; j < N;++j) {
		for(i=j;i < M;++i) {
			x[i-j] = A[i*N+j];

		}

		beta = house(x,M-j,v);

		for (i=j; i < M; i++) {
			t = i * N;
			u = 0;
			for (k=j; k < N; k++) {
				AT[u+i-j] = A[k+t];
				u+=(M-j);

			}

		}


		mmult(AT,v,w,N-j,M-j,1);
		scale(w,N-j,1,beta);
		mmult(v,w,AT,M-j,1,N-j);
		for (i=j; i < M; i++) {
			t = i *N;
			for (k=j; k < N; k++) {
				A[t+k] -= AT[(i-j)*(N-j) + k - j];
			}
		}

		for(i=j+1;i < M;++i) {
			A[i*N+j] = v[i-j];
		}

		if (j < N - 2) {
			for(i=j+1;i < N;++i) {
				x[i-j-1] = A[j*N+i];
			}
			beta = house(x,N-j-1,v);

			for (i=j; i < M; i++) {
				t = i * N;
				u = (i-j) *(N-j-1);
				for (k=j+1; k < N; k++) {
					AT[u+k-j-1] = A[k+t];
				}
			}

			mmult(AT,v,w,M-j,N-j-1,1);
			scale(w,M-j,1,beta);
			mmult(w,v,AT,M-j,1,N-j-1);

			for (i=j; i < M; i++) {
				t = i * N;
				u = (i-j) *(N-j-1);
				for (k=j+1; k < N; k++) {
					A[k+t] -= AT[u+k-j-1];
				}
			}
			u = 1;
			t = j*N;
			for(i = j + 2; i < N;++i) {
				A[t+i] = v[u];
				u++;
			}

		}

	}


	free(x);
	free(v);
	free(AT);

}